

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::pumpTo
          (PromisedAsyncIoStream *this,AsyncOutputStream *output,uint64_t amount)

{
  AsyncIoStream *pAVar1;
  Own<kj::AsyncIoStream,_std::nullptr_t> *in_RCX;
  Own<kj::AsyncIoStream,_std::nullptr_t> *local_38;
  Own<kj::AsyncIoStream,_std::nullptr_t> *s;
  Own<kj::AsyncIoStream,_std::nullptr_t> *_s2398;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  PromisedAsyncIoStream *this_local;
  
  _s2398 = in_RCX;
  amount_local = amount;
  output_local = output;
  this_local = this;
  local_38 = kj::_::readMaybe<kj::AsyncIoStream,decltype(nullptr)>
                       ((Maybe<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)(output + 5));
  s = local_38;
  if (local_38 == (Own<kj::AsyncIoStream,_std::nullptr_t> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&stack0xffffffffffffffc0);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromisedAsyncIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(Type *)&stack0xffffffffffffffc0);
    Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffc0);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(local_38);
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[3])(this,pAVar1,amount_local,_s2398);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
    KJ_IF_SOME(s, stream) {
      return s->pumpTo(output, amount);
    } else {
      return promise.addBranch().then([this,&output,amount]() {
        return KJ_ASSERT_NONNULL(stream)->pumpTo(output, amount);
      });
    }
  }